

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_stream.cpp
# Opt level: O0

bool __thiscall dap::ContentReader::buffer(ContentReader *this,size_t bytes)

{
  size_type sVar1;
  unsigned_long *puVar2;
  element_type *peVar3;
  ulong uVar4;
  ulong local_148;
  size_t i;
  size_t numGot;
  unsigned_long local_130;
  unsigned_long numWant;
  uint8_t chunk [256];
  size_t local_20;
  size_t bytes_local;
  ContentReader *this_local;
  
  local_20 = bytes;
  bytes_local = (size_t)this;
  sVar1 = std::deque<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->buf);
  if (sVar1 <= bytes) {
    sVar1 = std::deque<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->buf);
    for (local_20 = local_20 - sVar1; local_20 != 0; local_20 = local_20 - uVar4) {
      numGot = 0x100;
      puVar2 = std::min<unsigned_long>(&numGot,&local_20);
      local_130 = *puVar2;
      peVar3 = std::__shared_ptr_access<dap::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<dap::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      uVar4 = (**(code **)((long)*peVar3 + 0x20))(peVar3,&numWant,local_130);
      if (uVar4 == 0) {
        return false;
      }
      for (local_148 = 0; local_148 < uVar4; local_148 = local_148 + 1) {
        std::deque<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                  (&this->buf,chunk + (local_148 - 8));
      }
    }
  }
  return true;
}

Assistant:

bool ContentReader::buffer(size_t bytes) {
  if (bytes < buf.size()) {
    return true;
  }
  bytes -= buf.size();
  while (bytes > 0) {
    uint8_t chunk[256];
    auto numWant = std::min(sizeof(chunk), bytes);
    auto numGot = reader->read(chunk, numWant);
    if (numGot == 0) {
      return false;
    }
    for (size_t i = 0; i < numGot; i++) {
      buf.push_back(chunk[i]);
    }
    bytes -= numGot;
  }
  return true;
}